

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O3

bool __thiscall
glcts::GeometryShaderPrimitiveCounter::checkResult(GeometryShaderPrimitiveCounter *this,GLint *data)

{
  uint uVar1;
  ostringstream *this_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  uVar3 = (this->m_testConfiguration).m_numberOfDrawnPrimitives;
  if (uVar3 == 0) {
    bVar2 = true;
  }
  else {
    this_00 = (ostringstream *)(local_1b0 + 8);
    bVar2 = true;
    uVar5 = 0;
    do {
      iVar4 = this->m_nrVaryings * this->m_maxGeometryOutputVertices;
      uVar1 = uVar5 + 1;
      if (iVar4 * uVar5 < iVar4 * uVar1) {
        uVar6 = (ulong)(iVar4 * uVar5);
        do {
          if (data[uVar6] != uVar5) {
            local_1b0._0_8_ =
                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"Rendered value at index ",0x18);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"/",1);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]: ",3);
            std::ostream::operator<<(this_00,data[uVar6]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," != ",4);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            bVar2 = false;
          }
          uVar6 = uVar6 + 1;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
        uVar3 = (this->m_testConfiguration).m_numberOfDrawnPrimitives;
      }
      uVar5 = uVar1;
    } while (uVar1 < uVar3);
  }
  return bVar2;
}

Assistant:

bool GeometryShaderPrimitiveCounter::checkResult(const glw::GLint* data)
{
	bool testPassed = true;

	for (unsigned int nDrawnPrimitive = 0; nDrawnPrimitive < m_testConfiguration.m_numberOfDrawnPrimitives;
		 nDrawnPrimitive++)
	{
		unsigned int nEmittedValuesPerPrimitive = m_maxGeometryOutputVertices * m_nrVaryings;

		for (unsigned int nValue = (nEmittedValuesPerPrimitive * (nDrawnPrimitive));
			 nValue < (nEmittedValuesPerPrimitive * (nDrawnPrimitive + 1)); nValue++)
		{
			if ((unsigned int)data[nValue] != nDrawnPrimitive)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Rendered value at index "
								   << "[" << nValue << "/" << (m_testConfiguration.m_numberOfDrawnPrimitives *
															   m_maxGeometryOutputVertices * m_nrVaryings)
								   << "]: " << data[nValue] << " != " << nEmittedValuesPerPrimitive
								   << tcu::TestLog::EndMessage;

				testPassed = false;
			}
		} /* for (all values) */
	}	 /* for (all primitives) */

	return testPassed;
}